

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pSVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  type_conflict5 tVar7;
  int iVar8;
  DataKey DVar9;
  SPxId SVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  ulong local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  local_e8.m_backend.fpclass = cpp_dec_float_finite;
  local_e8.m_backend.prec_elem = 10;
  local_e8.m_backend.data._M_elems[0] = 0;
  local_e8.m_backend.data._M_elems[1] = 0;
  local_e8.m_backend.data._M_elems[2] = 0;
  local_e8.m_backend.data._M_elems[3] = 0;
  local_e8.m_backend.data._M_elems[4] = 0;
  local_e8.m_backend.data._M_elems[5] = 0;
  local_e8.m_backend.data._M_elems._24_5_ = 0;
  local_e8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_e8.m_backend.data._M_elems._32_5_ = 0;
  local_e8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_e8.m_backend.exp = 0;
  local_e8.m_backend.neg = false;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if (pSVar2->thePricing == PARTIAL) {
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    result.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    result.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 6);
    result.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    result.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    result.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    result.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    uVar18 = (ulong)(uint)this->used;
    local_a8 = CONCAT44(local_a8._4_4_,this->last);
    lVar17 = uVar18 << 6;
    while( true ) {
      if ((int)uVar18 < 1) break;
      iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::number(&((this->
                         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).thesolver)->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,(SPxId *)((long)&(this->pricSet).data.
                                         super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].test.
                                         m_backend + lVar17 + -8));
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      pSVar3 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pSVar2->theRep * *(int *)((long)&pSVar3[-1].test.m_backend + lVar17 + -8) < 1) {
        pnVar4 = (pSVar2->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(undefined8 *)((long)&pnVar4[iVar8].m_backend.data + 0x20);
        result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
        result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar8].m_backend.data;
        result_1.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar4[iVar8].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[iVar8].m_backend.data + 0x10);
        result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        result_1.m_backend.exp = pnVar4[iVar8].m_backend.exp;
        result_1.m_backend.neg = pnVar4[iVar8].m_backend.neg;
        result_1.m_backend.fpclass = pnVar4[iVar8].m_backend.fpclass;
        result_1.m_backend.prec_elem = pnVar4[iVar8].m_backend.prec_elem;
        *(undefined8 *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x20) = uVar5;
        puVar1 = (uint *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x10);
        *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = uVar6;
        puVar1 = (uint *)((long)&pSVar3[-1].test.m_backend + lVar17);
        *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._8_8_;
        *(int *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x28) = result_1.m_backend.exp;
        *(bool *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x2c) = result_1.m_backend.neg;
        *(undefined8 *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x30) =
             result_1.m_backend._48_8_;
      }
      else {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computePvec(&local_a0,pSVar2,iVar8);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computeTest(&local_a0,
                      (this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver,iVar8);
        result_1.m_backend.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
        result_1.m_backend.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
        result_1.m_backend.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        result_1.m_backend.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        result_1.m_backend.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
        result_1.m_backend.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
        result_1.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        result_1.m_backend.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        result_1.m_backend.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        result_1.m_backend.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        result_1.m_backend.exp = local_a0.m_backend.exp;
        result_1.m_backend.neg = local_a0.m_backend.neg;
        result_1.m_backend.fpclass = local_a0.m_backend.fpclass;
        result_1.m_backend.prec_elem = local_a0.m_backend.prec_elem;
        pSVar3 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x20) =
             local_a0.m_backend.data._M_elems._32_8_;
        puVar1 = (uint *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x10);
        *(undefined8 *)puVar1 = local_a0.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_a0.m_backend.data._M_elems._24_8_;
        puVar1 = (uint *)((long)&pSVar3[-1].test.m_backend + lVar17);
        *(undefined8 *)puVar1 = local_a0.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_a0.m_backend.data._M_elems._8_8_;
        *(int *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x28) = local_a0.m_backend.exp;
        *(bool *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x2c) = local_a0.m_backend.neg;
        *(undefined8 *)((long)&pSVar3[-1].test.m_backend + lVar17 + 0x30) =
             local_a0.m_backend._48_8_;
      }
      tVar7 = boost::multiprecision::operator>=(&result_1,&result);
      if (tVar7) {
        lVar16 = (long)this->used + -1;
        this->used = (int)lVar16;
        pSVar3 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        SPxParMultPr_Tmp::operator=
                  ((SPxParMultPr_Tmp *)((long)&pSVar3[-1].test.m_backend + lVar17 + -8),
                   pSVar3 + lVar16);
      }
      uVar18 = (ulong)((int)uVar18 - 1);
      lVar17 = lVar17 + -0x40;
    }
    while (iVar8 = this->used,
          (int)((ulong)((long)(this->pricSet).data.
                              super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->pricSet).data.
                             super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) - iVar8 <
          this->partialSize) {
      lVar17 = 0x48;
      lVar16 = 1;
      iVar15 = 0;
      while( true ) {
        if (iVar8 <= lVar16) break;
        pSVar3 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(pSVar3->test).m_backend + lVar17 + -8),&pSVar3[iVar15].test);
        iVar11 = (int)lVar16;
        if (!tVar7) {
          iVar11 = iVar15;
        }
        lVar16 = lVar16 + 1;
        iVar8 = this->used;
        lVar17 = lVar17 + 0x40;
        iVar15 = iVar11;
      }
      this->used = iVar8 + -1;
      pSVar3 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      SPxParMultPr_Tmp::operator=(pSVar3 + iVar15,pSVar3 + (long)iVar8 + -1);
    }
    iVar8 = this->multiParts;
    iVar15 = this->last;
    iVar11 = (int)local_a8;
    do {
      uVar13 = (iVar15 + 1) % iVar8;
      this->last = uVar13;
      for (iVar15 = ~uVar13 + (((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver)->thevectors->set).thenum;
          pSVar2 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver, -1 < iVar15; iVar15 = iVar15 - iVar8) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computePvec(&local_a0,pSVar2,iVar15);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computeTest(&local_a0,
                      (this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver,iVar15);
        local_e8.m_backend.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
        local_e8.m_backend.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
        local_e8.m_backend.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.m_backend.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.m_backend.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
        local_e8.m_backend.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
        local_e8.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.m_backend.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        local_e8.m_backend.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.m_backend.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.m_backend.exp = local_a0.m_backend.exp;
        local_e8.m_backend.neg = local_a0.m_backend.neg;
        local_e8.m_backend.fpclass = local_a0.m_backend.fpclass;
        local_e8.m_backend.prec_elem = local_a0.m_backend.prec_elem;
        tVar7 = boost::multiprecision::operator<(&local_e8,&result);
        if (tVar7) {
          SVar10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::id((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver,iVar15);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar10.super_DataKey;
          iVar8 = this->used;
          pSVar3 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&pSVar3[iVar8].test.m_backend + 0x20) =
               CONCAT35(local_e8.m_backend.data._M_elems[9]._1_3_,
                        local_e8.m_backend.data._M_elems._32_5_);
          puVar1 = (uint *)((long)&pSVar3[iVar8].test.m_backend + 0x10);
          *(undefined8 *)puVar1 = local_e8.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_e8.m_backend.data._M_elems[7]._1_3_,
                        local_e8.m_backend.data._M_elems._24_5_);
          *(undefined8 *)&pSVar3[iVar8].test.m_backend = local_e8.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((long)&pSVar3[iVar8].test.m_backend + 8) =
               local_e8.m_backend.data._M_elems._8_8_;
          *(int *)((long)&pSVar3[iVar8].test.m_backend + 0x28) = local_e8.m_backend.exp;
          *(bool *)((long)&pSVar3[iVar8].test.m_backend + 0x2c) = local_e8.m_backend.neg;
          *(undefined8 *)((long)&pSVar3[iVar8].test.m_backend + 0x30) = local_e8.m_backend._48_8_;
          this->used = this->used + 1;
        }
        iVar8 = this->multiParts;
      }
      for (uVar13 = ~this->last + (pSVar2->thecovectors->set).thenum; -1 < (int)uVar13;
          uVar13 = uVar13 - iVar8) {
        pnVar4 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 0x20);
        local_e8.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_e8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[uVar13].m_backend.data;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[uVar13].m_backend.data + 0x10);
        local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_e8.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_e8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_e8.m_backend.exp = pnVar4[uVar13].m_backend.exp;
        local_e8.m_backend.neg = pnVar4[uVar13].m_backend.neg;
        local_e8.m_backend.fpclass = pnVar4[uVar13].m_backend.fpclass;
        local_e8.m_backend.prec_elem = pnVar4[uVar13].m_backend.prec_elem;
        tVar7 = boost::multiprecision::operator<(&local_e8,&result);
        if (tVar7) {
          SVar10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::coId((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,uVar13);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar10.super_DataKey;
          iVar8 = this->used;
          pSVar3 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&pSVar3[iVar8].test.m_backend + 0x20) =
               CONCAT35(local_e8.m_backend.data._M_elems[9]._1_3_,
                        local_e8.m_backend.data._M_elems._32_5_);
          puVar1 = (uint *)((long)&pSVar3[iVar8].test.m_backend + 0x10);
          *(undefined8 *)puVar1 = local_e8.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_e8.m_backend.data._M_elems[7]._1_3_,
                        local_e8.m_backend.data._M_elems._24_5_);
          *(undefined8 *)&pSVar3[iVar8].test.m_backend = local_e8.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((long)&pSVar3[iVar8].test.m_backend + 8) =
               local_e8.m_backend.data._M_elems._8_8_;
          *(int *)((long)&pSVar3[iVar8].test.m_backend + 0x28) = local_e8.m_backend.exp;
          *(bool *)((long)&pSVar3[iVar8].test.m_backend + 0x2c) = local_e8.m_backend.neg;
          *(undefined8 *)((long)&pSVar3[iVar8].test.m_backend + 0x30) = local_e8.m_backend._48_8_;
          this->used = this->used + 1;
        }
        iVar8 = this->multiParts;
      }
      iVar14 = this->used;
    } while ((iVar14 < this->min) && (iVar15 = this->last, iVar15 != iVar11));
    DVar9.info = 0;
    DVar9.idx = 0;
    if (iVar14 < 1) {
      local_a8 = 0xffffffff00000000;
    }
    else {
      iVar8 = this->partialSize;
      if (iVar14 + 1 < this->partialSize) {
        iVar8 = iVar14 + 1;
      }
      this->min = iVar8;
      lVar17 = 1;
      lVar16 = 0x48;
      while( true ) {
        uVar13 = DVar9.info;
        if (iVar14 <= lVar17) break;
        pSVar3 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(pSVar3->test).m_backend + lVar16 + -8),
                           &pSVar3[(int)uVar13].test);
        uVar12 = (uint)lVar17;
        if (!tVar7) {
          uVar12 = uVar13;
        }
        lVar17 = lVar17 + 1;
        iVar14 = this->used;
        lVar16 = lVar16 + 0x40;
        DVar9.idx = 0;
        DVar9.info = uVar12;
      }
      DVar9 = (this->pricSet).data.
              super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)uVar13].id.super_DataKey;
      local_a8 = (ulong)DVar9 & 0xffffffff00000000;
    }
  }
  else {
    uVar5 = *(undefined8 *)
             ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.data._M_elems + 8);
    result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
    result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    result_1.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    result_1.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    result_1.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    uVar5 = *(undefined8 *)
             ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.data._M_elems + 6);
    result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
    result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    result_1.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    result_1.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    result_1.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    result_1.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    uVar13 = (pSVar2->thecovectors->set).thenum;
    DVar9.info = 0;
    DVar9.idx = 0;
    local_a8 = 0xffffffff00000000;
    while (pSVar2 = (this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver, 0 < (int)uVar13) {
      uVar13 = uVar13 - 1;
      pnVar4 = (pSVar2->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 0x20);
      local_e8.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_e8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[uVar13].m_backend.data;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[uVar13].m_backend.data + 0x10);
      local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_e8.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_e8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_e8.m_backend.exp = pnVar4[uVar13].m_backend.exp;
      local_e8.m_backend.neg = pnVar4[uVar13].m_backend.neg;
      local_e8.m_backend.fpclass = pnVar4[uVar13].m_backend.fpclass;
      local_e8.m_backend.prec_elem = pnVar4[uVar13].m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator<(&local_e8,&result_1);
      if (tVar7) {
        DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,uVar13);
        local_a8 = (ulong)DVar9 & 0xffffffff00000000;
        pnVar4 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 0x20);
        result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
        result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[uVar13].m_backend.data;
        result_1.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[uVar13].m_backend.data + 0x10);
        result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
        result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        result_1.m_backend.exp = pnVar4[uVar13].m_backend.exp;
        result_1.m_backend.neg = pnVar4[uVar13].m_backend.neg;
        result_1.m_backend.fpclass = pnVar4[uVar13].m_backend.fpclass;
        result_1.m_backend.prec_elem = pnVar4[uVar13].m_backend.prec_elem;
      }
    }
    uVar13 = (pSVar2->thevectors->set).thenum;
    while (0 < (int)uVar13) {
      uVar13 = uVar13 - 1;
      pnVar4 = (((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 0x20);
      local_e8.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_e8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[uVar13].m_backend.data;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[uVar13].m_backend.data + 0x10);
      local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_e8.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_e8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_e8.m_backend.exp = pnVar4[uVar13].m_backend.exp;
      local_e8.m_backend.neg = pnVar4[uVar13].m_backend.neg;
      local_e8.m_backend.fpclass = pnVar4[uVar13].m_backend.fpclass;
      local_e8.m_backend.prec_elem = pnVar4[uVar13].m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator<(&local_e8,&result_1);
      if (tVar7) {
        DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,uVar13);
        local_a8 = (ulong)DVar9 & 0xffffffff00000000;
        pnVar4 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 0x20);
        result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
        result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[uVar13].m_backend.data;
        result_1.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar4[uVar13].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[uVar13].m_backend.data + 0x10);
        result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
        result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        result_1.m_backend.exp = pnVar4[uVar13].m_backend.exp;
        result_1.m_backend.neg = pnVar4[uVar13].m_backend.neg;
        result_1.m_backend.fpclass = pnVar4[uVar13].m_backend.fpclass;
        result_1.m_backend.prec_elem = pnVar4[uVar13].m_backend.prec_elem;
      }
    }
  }
  return (SPxId)((ulong)DVar9 & 0xffffffff | local_a8 & 0xffffffff00000000);
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}